

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTPNStmBase::gen_code_substm(CTPNStmBase *this,CTPNStm *substm)

{
  CTcTokenizer *pCVar1;
  CTcTokFileDesc *pCVar2;
  long lVar3;
  CTPNStmBase *in_RSI;
  CTPNStmBase *in_RDI;
  
  pCVar1 = G_tok;
  pCVar2 = get_source_desc(in_RSI);
  lVar3 = get_source_linenum(in_RSI);
  CTcTokenizer::set_line_info(pCVar1,pCVar2,lVar3);
  (**(in_RSI->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)(in_RSI,1);
  pCVar1 = G_tok;
  pCVar2 = get_source_desc(in_RDI);
  lVar3 = get_source_linenum(in_RDI);
  CTcTokenizer::set_line_info(pCVar1,pCVar2,lVar3);
  return;
}

Assistant:

void CTPNStmBase::gen_code_substm(CTPNStm *substm)
{
    /* set the error reporting location to refer to the sub-statement */
    G_tok->set_line_info(substm->get_source_desc(),
                         substm->get_source_linenum());

    /* generate code for the sub-statement */
    substm->gen_code(TRUE, TRUE);

    /* restore the error reporting location to the main statement */
    G_tok->set_line_info(get_source_desc(), get_source_linenum());
}